

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

Vec_Int_t * Wlc_NtkCollectMemory(Wlc_Ntk_t *p,int fClean)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int Id;
  Vec_Int_t *vTemp;
  
  uVar5 = (ulong)(uint)fClean;
  pVVar2 = Wlc_NtkCollectMemSizes(p);
  p_00 = Vec_IntAlloc(10);
  uVar6 = 1;
  do {
    iVar1 = (int)uVar5;
    Id = (int)uVar6;
    if (p->iObj <= Id) {
      Vec_IntFree(pVVar2);
      Vec_IntSort(p_00,iVar1);
      if (fClean != 0) {
        pVVar2 = Wlc_NtkCleanObjects(p,p_00);
        Vec_IntFree(p_00);
        p_00 = pVVar2;
      }
      return p_00;
    }
    pWVar3 = Wlc_NtkObj(p,Id);
    if ((undefined1  [24])((undefined1  [24])*pWVar3 & (undefined1  [24])0x3e) ==
        (undefined1  [24])0x36) {
LAB_00300251:
      Vec_IntPush(p_00,Id);
      uVar5 = uVar6;
    }
    else {
      iVar4 = pWVar3->End - pWVar3->Beg;
      iVar1 = -iVar4;
      if (0 < iVar4) {
        iVar1 = iVar4;
      }
      uVar5 = (ulong)(iVar1 + 1U);
      iVar1 = Vec_IntFind(pVVar2,iVar1 + 1U);
      if (-1 < iVar1) goto LAB_00300251;
    }
    uVar6 = (ulong)(Id + 1);
  } while( true );
}

Assistant:

Vec_Int_t * Wlc_NtkCollectMemory( Wlc_Ntk_t * p, int fClean )
{
    Wlc_Obj_t * pObj; int i;
    Vec_Int_t * vMemSizes = Wlc_NtkCollectMemSizes( p );
    Vec_Int_t * vMemObjs = Vec_IntAlloc( 10 );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE || Wlc_ObjType(pObj) == WLC_OBJ_READ )
            Vec_IntPush( vMemObjs, i );
        else if ( Vec_IntFind(vMemSizes, Wlc_ObjRange(pObj)) >= 0 )
            Vec_IntPush( vMemObjs, i );
    }
    Vec_IntFree( vMemSizes );
    Vec_IntSort( vMemObjs, 0 );
    //Wlc_NtkPrintNodeArray( p, vMemObjs ); 
    if ( fClean )
    {
        Vec_Int_t * vTemp;
        vMemObjs = Wlc_NtkCleanObjects( p, vTemp = vMemObjs );
        Vec_IntFree( vTemp );
    }
    return vMemObjs;
}